

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iep2_test.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  iep2_test_cfg local_198;
  
  if (argc < 2) {
    iep2_test_help();
    iVar1 = 0;
  }
  else {
    memset(&local_198,0,0x168);
    local_198.src_fmt = 3;
    _opterr = 0;
    local_198.dst_fmt = local_198.src_fmt;
switchD_00102c04_caseD_67:
    do {
      iVar1 = getopt(argc,argv,"i:w:h:c:o:C:v:f:");
      switch(iVar1) {
      case 0x66:
        iVar1 = strcmp(_optarg,"TFF");
        if (iVar1 == 0) {
          local_198.field_order = 0;
        }
        else {
          local_198.field_order = 1;
        }
      case 0x67:
      case 0x6a:
      case 0x6b:
      case 0x6c:
      case 0x6d:
      case 0x6e:
        goto switchD_00102c04_caseD_67;
      case 0x68:
        local_198.h = atoi(_optarg);
        goto switchD_00102c04_caseD_67;
      case 0x69:
        _mpp_log_l(4,"iep2_test","input filename: %s\n",0,_optarg);
        strncpy(local_198.src_url,_optarg,99);
        local_198.fp_src = (FILE *)fopen(local_198.src_url,"rb");
        goto switchD_00102c04_caseD_67;
      case 0x6f:
        _mpp_log_l(4,"iep2_test","output filename: %s\n",0,_optarg);
        strncpy(local_198.dst_url,_optarg,99);
        local_198.fp_dst = (FILE *)fopen(local_198.dst_url,"w+b");
        goto switchD_00102c04_caseD_67;
      }
      if (iVar1 == 0x43) {
        local_198.dst_fmt = str_to_iep2_fmt(_optarg);
        local_198.dst_swa = str_to_iep2_swa(_optarg);
        goto switchD_00102c04_caseD_67;
      }
      if (iVar1 == 99) {
        local_198.src_fmt = str_to_iep2_fmt(_optarg);
        local_198.src_swa = str_to_iep2_swa(_optarg);
        goto switchD_00102c04_caseD_67;
      }
      if (iVar1 == 0x76) {
        _mpp_log_l(4,"iep2_test","verify file: %s\n",0,_optarg);
        strncpy(local_198.slt_url,_optarg,99);
        local_198.fp_slt = (FILE *)fopen(local_198.slt_url,"w+b");
        goto switchD_00102c04_caseD_67;
      }
      if (iVar1 == 0x77) {
        local_198.w = atoi(_optarg);
        goto switchD_00102c04_caseD_67;
      }
    } while (iVar1 != -1);
    iVar1 = 0;
    if (local_198.w - 0x781U < 0xfffff88f) {
      _mpp_log_l(2,"iep2_test","invalid width %d\n",0);
      iVar1 = -1;
    }
    if (local_198.h - 0x441U < 0xfffffbc3) {
      _mpp_log_l(2,"iep2_test","invalid height %d\n",0);
      iVar1 = -1;
    }
    _mpp_log_l(4,"iep2_test","src fmt %d, %d dst fmt %d, %d\n",0,local_198.src_fmt,local_198.src_swa
               ,local_198.dst_fmt,local_198.dst_swa);
    if ((local_198.src_fmt - 4U < 0xfffffffe) || (3 < (uint)local_198.src_swa)) {
      _mpp_log_l(2,"iep2_test","invalid input format\n",0);
      iVar1 = -1;
    }
    if ((FILE *)local_198.fp_src == (FILE *)0x0) {
      _mpp_log_l(2,"iep2_test","failed to open input file %s\n",0,local_198.src_url);
      iVar1 = -1;
    }
    if ((local_198.dst_fmt - 4U < 0xfffffffe) || (1 < (uint)local_198.dst_swa)) {
      _mpp_log_l(2,"iep2_test","invalid output format\n",0);
    }
    else if (iVar1 == 0) {
      iep2_test(&local_198);
      if ((FILE *)local_198.fp_src != (FILE *)0x0) {
        fclose((FILE *)local_198.fp_src);
        local_198.fp_src = (FILE *)0x0;
      }
      if ((FILE *)local_198.fp_dst != (FILE *)0x0) {
        fclose((FILE *)local_198.fp_dst);
        local_198.fp_dst = (FILE *)0x0;
      }
      if ((FILE *)local_198.fp_slt == (FILE *)0x0) {
        return 0;
      }
      fclose((FILE *)local_198.fp_slt);
      return 0;
    }
    iVar1 = -1;
    _mpp_log_l(2,"iep2_test","failed to pass cmd line check\n",0);
    iep2_test_help();
  }
  return iVar1;
}

Assistant:

int main(int argc, char **argv)
{
    iep2_test_cfg cfg;
    int ch;

    if (argc < 2) {
        iep2_test_help();
        return 0;
    }

    memset(&cfg, 0, sizeof(cfg));
    cfg.src_fmt = IEP2_FMT_YUV420;
    cfg.src_swa = IEP2_YUV_SWAP_SP_UV;
    cfg.dst_fmt = IEP2_FMT_YUV420;
    cfg.dst_swa = IEP2_YUV_SWAP_SP_UV;

    /// get options
    opterr = 0;
    while ((ch = getopt(argc, argv, "i:w:h:c:o:C:v:f:")) != -1) {
        switch (ch) {
        case 'w': {
            cfg.w = atoi(optarg);
        } break;
        case 'h': {
            cfg.h = atoi(optarg);
        } break;
        case 'c': {
            cfg.src_fmt = str_to_iep2_fmt(optarg);
            cfg.src_swa = str_to_iep2_swa(optarg);
        } break;
        case 'C': {
            cfg.dst_fmt = str_to_iep2_fmt(optarg);
            cfg.dst_swa = str_to_iep2_swa(optarg);
        } break;
        case 'i': {
            mpp_log("input filename: %s\n", optarg);
            strncpy(cfg.src_url, optarg, sizeof(cfg.src_url) - 1);
            cfg.fp_src = fopen(cfg.src_url, "rb");
        } break;
        case 'o': {
            mpp_log("output filename: %s\n", optarg);
            strncpy(cfg.dst_url, optarg, sizeof(cfg.dst_url) - 1);
            cfg.fp_dst = fopen(cfg.dst_url, "w+b");
        } break;
        case 'v': {
            mpp_log("verify file: %s\n", optarg);
            strncpy(cfg.slt_url, optarg, sizeof(cfg.slt_url) - 1);
            cfg.fp_slt = fopen(cfg.slt_url, "w+b");
        } break;
        case 'f': {
            if (!strcmp(optarg, "TFF"))
                cfg.field_order = IEP2_FIELD_ORDER_TFF;
            else
                cfg.field_order = IEP2_FIELD_ORDER_BFF;
        } break;
        default: {
        } break;
        }
    }

    if (check_input_cmd(&cfg)) {
        mpp_err("failed to pass cmd line check\n");
        iep2_test_help();
        return -1;
    }

    iep2_test(&cfg);

    if (cfg.fp_src) {
        fclose(cfg.fp_src);
        cfg.fp_src = NULL;
    }

    if (cfg.fp_dst) {
        fclose(cfg.fp_dst);
        cfg.fp_dst = NULL;
    }

    if (cfg.fp_slt) {
        fclose(cfg.fp_slt);
        cfg.fp_slt = NULL;
    }

    return 0;
}